

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall cmCPackDebGenerator::InitializeInternal(cmCPackDebGenerator *this)

{
  bool bVar1;
  int iVar2;
  char *val;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"CPACK_PACKAGING_INSTALL_PREFIX",&local_31);
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_30,"/usr");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"CPACK_SET_DESTDIR",&local_31);
  val = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_30);
  bVar1 = cmSystemTools::IsOff(val);
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_30,"CPACK_SET_DESTDIR",&local_31);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_30,"I_ON");
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar2 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar2;
}

Assistant:

int cmCPackDebGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_PACKAGING_INSTALL_PREFIX", "/usr");
  if (cmSystemTools::IsOff(this->GetOption("CPACK_SET_DESTDIR")))
    {
    this->SetOption("CPACK_SET_DESTDIR", "I_ON");
    }
  return this->Superclass::InitializeInternal();
}